

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

int get_xwinprop(Window wnd,Atom prop,long max_length,unsigned_long *nitems,unsigned_long **data)

{
  int iVar1;
  undefined1 local_60 [8];
  unsigned_long bytes_after;
  long lStack_50;
  int format;
  Atom actual;
  unsigned_long **data_local;
  unsigned_long *nitems_local;
  long max_length_local;
  Atom prop_local;
  Window wnd_local;
  
  actual = (Atom)data;
  data_local = (unsigned_long **)nitems;
  nitems_local = (unsigned_long *)max_length;
  max_length_local = prop;
  prop_local = wnd;
  iVar1 = XGetWindowProperty(fl_display,wnd,prop,0,max_length,0,0,&stack0xffffffffffffffb0,
                             (long)&bytes_after + 4,nitems,local_60,data);
  if (iVar1 == 0) {
    if ((lStack_50 == 0) || (bytes_after._4_4_ != 0x20)) {
      wnd_local._4_4_ = -1;
    }
    else {
      wnd_local._4_4_ = 0;
    }
  }
  else {
    wnd_local._4_4_ = -1;
  }
  return wnd_local._4_4_;
}

Assistant:

static int get_xwinprop(Window wnd, Atom prop, long max_length,
                        unsigned long *nitems, unsigned long **data) {
  Atom actual;
  int format;
  unsigned long bytes_after;
  
  if (Success != XGetWindowProperty(fl_display, wnd, prop, 0, max_length, 
                                    False, AnyPropertyType, &actual, &format, 
                                    nitems, &bytes_after, (unsigned char**)data)) {
    return -1;
  }

  if (actual == None || format != 32) {
    return -1;
  }

  return 0;
}